

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  domain_error *this;
  istream *piVar5;
  byte local_36a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator local_2e1;
  string local_2e0;
  byte local_2bb;
  byte local_2ba;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  undefined1 local_278 [8];
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  istream local_220 [8];
  ifstream f;
  string *_filename_local;
  ConfigData *config_local;
  
  uVar4 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar4,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string((string *)local_278);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_220,(string *)local_278);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      trim(&local_298,(string *)local_278);
      std::__cxx11::string::operator=((string *)local_278,(string *)&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      uVar3 = std::__cxx11::string::empty();
      local_2ba = 0;
      local_2bb = 0;
      local_36a = 0;
      if ((uVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        local_2ba = 1;
        std::__cxx11::string::string((string *)&local_2b8,"#",&local_2b9);
        local_2bb = 1;
        bVar2 = startsWith((string *)local_278,&local_2b8);
        local_36a = bVar2 ^ 0xff;
      }
      if ((local_2bb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_2b8);
      }
      if ((local_2ba & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      }
      if ((local_36a & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2e0,"\"",&local_2e1);
        bVar2 = startsWith((string *)local_278,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          std::operator+(&local_328,"\"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
          std::operator+(&local_308,&local_328,"\"");
          std::__cxx11::string::operator=((string *)local_278,(string *)&local_308);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)&local_328);
        }
        std::operator+(&local_348,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,",");
        addTestOrTags(config,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
      }
    }
    std::__cxx11::string::~string((string *)local_278);
    std::ifstream::~ifstream(local_220);
    return;
  }
  line.field_2._M_local_buf[0xf] = '\x01';
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_250,"Unable to load input file: ",_filename);
  std::domain_error::domain_error(this,(string *)&local_250);
  line.field_2._M_local_buf[0xf] = '\0';
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) ) {
                if( !startsWith( line, "\"" ) )
                    line = "\"" + line + "\"";
                addTestOrTags( config, line + "," );
            }
        }
    }